

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipState.hpp
# Opt level: O2

void __thiscall
linq::SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::Init
          (SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>
           *this)

{
  pointer piVar1;
  ulong uVar2;
  pointer piVar3;
  ulong uVar4;
  
  this->current = 0;
  piVar3 = (this->source).source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->source).source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->source).current._M_current = piVar3;
  (this->source).end._M_current = piVar1;
  uVar2 = this->count;
  uVar4 = 0;
  while ((uVar4 < uVar2 && (piVar3 != piVar1))) {
    piVar3 = piVar3 + 1;
    (this->source).current._M_current = piVar3;
    uVar4 = uVar4 + 1;
    this->current = uVar4;
  }
  return;
}

Assistant:

void Init() override final
			{
				current = 0;
				source.Init(); 
				
				while(current < count && source.Valid()) {
					source.Advance();
					current++;
				}
			}